

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphs.cpp
# Opt level: O3

void __thiscall Graph::readEdgesFromfile(Graph *this,string *inputFile)

{
  pointer pcVar1;
  char cVar2;
  ostream *poVar3;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  ifstream is;
  undefined1 *local_318;
  long local_310;
  undefined1 local_308 [16];
  Graph *local_2f8;
  string local_2f0;
  string local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  string local_298;
  string local_278;
  string local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_2f8 = this;
  std::ifstream::ifstream(local_238,(string *)inputFile,_S_in);
  local_318 = local_308;
  local_310 = 0;
  local_308[0] = 0;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    cVar2 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_318,cVar2);
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
      do {
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_318,local_318 + local_310);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"\t","");
        split(&local_2b0,&local_278,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        if ((long)local_2b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_2b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x60) {
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          pcVar1 = ((local_2b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,pcVar1,
                     pcVar1 + (local_2b0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          pcVar1 = local_2b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f0,pcVar1,
                     pcVar1 + local_2b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          pcVar1 = local_2b0.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,pcVar1,
                     pcVar1 + local_2b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
          insertEdge(local_2f8,&local_2d0,&local_2f0,&local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p);
          }
        }
        cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_318,cVar2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2b0);
      } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0);
    }
    std::ifstream::close();
    if (local_318 != local_308) {
      operator_delete(local_318);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(inputFile->_M_dataplus)._M_p,
                      inputFile->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"open failed.",0xc);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(100);
}

Assistant:

void Graph::readEdgesFromfile(string inputFile) {
    ifstream is(inputFile);
    string line;

    if (!is.is_open()) {
        cout << inputFile << "open failed." << endl;
        exit(100);
    }

    getline(is, line);

    while (!is.eof()) {
        vector<string> v = split(line, "\t");

        if (v.size() != 3) {
            getline(is, line);
            continue;
        }

        this->insertEdge(v[0], v[1], v[2]);

        getline(is, line);
    }

    is.close();
}